

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

double __thiscall despot::BaseTag::Reward(BaseTag *this,int s,ACT_TYPE action)

{
  int iVar1;
  value_type pTVar2;
  ACT_TYPE AVar3;
  const_reference ppTVar4;
  const_reference pvVar5;
  double local_28;
  double reward;
  TagState *state;
  ACT_TYPE action_local;
  int s_local;
  BaseTag *this_local;
  
  ppTVar4 = std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::operator[]
                      (&this->states_,(long)s);
  pTVar2 = *ppTVar4;
  AVar3 = TagAction(this);
  if (action == AVar3) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->rob_,(long)*(int *)&pTVar2->field_0xc);
    iVar1 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->opp_,(long)*(int *)&pTVar2->field_0xc);
    if (iVar1 == *pvVar5) {
      local_28 = TAG_REWARD;
    }
    else {
      local_28 = -TAG_REWARD;
    }
  }
  else {
    local_28 = -1.0;
  }
  return local_28;
}

Assistant:

double BaseTag::Reward(int s, ACT_TYPE action) const {
	const TagState* state = states_[s];
	double reward = 0;
	if (action == TagAction()) {
		if (rob_[state->state_id] == opp_[state->state_id]) {
			reward = TAG_REWARD;
		} else {
			reward = -TAG_REWARD;
		}
	} else {
		reward = -1;
	}
	return reward;
}